

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

optional<kernel::CCoinsStats> *
GetUTXOStats(optional<kernel::CCoinsStats> *__return_storage_ptr__,CCoinsView *view,
            BlockManager *blockman,CoinStatsHashType hash_type,function<void_()> *interruption_point
            ,CBlockIndex *pindex,bool index_requested)

{
  uint256 *puVar1;
  optional<kernel::CCoinsStats> *poVar2;
  CBlockIndex *pCVar3;
  CBlockIndex **ppCVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  bool local_79;
  unique_lock<std::recursive_mutex> local_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  uchar uStack_59;
  undefined8 local_58;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  optional<kernel::CCoinsStats> *local_38;
  
  local_38 = *(optional<kernel::CCoinsStats> **)(in_FS_OFFSET + 0x28);
  if (hash_type - MUHASH < 2) {
    if (!index_requested ||
        (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)
        g_coin_stats_index._M_t.
        super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
        super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
        super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)0x0)
    goto LAB_009a0766;
    if (pindex != (CBlockIndex *)0x0) {
      if (*(optional<kernel::CCoinsStats> **)(in_FS_OFFSET + 0x28) == local_38) {
        poVar2 = CoinStatsIndex::LookUpStats
                           (__return_storage_ptr__,
                            (CoinStatsIndex *)
                            g_coin_stats_index._M_t.
                            super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>
                            .super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl,pindex);
        return poVar2;
      }
      goto LAB_009a08e9;
    }
    local_78._M_device = &cs_main.super_recursive_mutex;
    local_78._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_78);
    (*view->_vptr_CCoinsView[2])(&local_58,view);
    pCVar3 = node::BlockManager::LookupBlockIndex(blockman,(uint256 *)&local_58);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
    local_58 = pCVar3;
    ppCVar4 = inline_check_non_fatal<CBlockIndex*>
                        ((CBlockIndex **)&local_58,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
                         ,0x396,"GetUTXOStats",
                         "WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()))"
                        );
    CoinStatsIndex::LookUpStats
              (__return_storage_ptr__,
               (CoinStatsIndex *)
               g_coin_stats_index._M_t.
               super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
               super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
               super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl,*ppCVar4);
  }
  else {
LAB_009a0766:
    if (pindex == (CBlockIndex *)0x0) {
      local_79 = true;
    }
    else {
      puVar1 = pindex->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58 = *(CBlockIndex **)(puVar1->super_base_blob<256U>).m_data._M_elems;
      _uStack_50 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      _local_48 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      _uStack_40 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      (*view->_vptr_CCoinsView[2])(&local_78,view);
      auVar6[0] = -(local_68 == local_48);
      auVar6[1] = -(uStack_67 == uStack_47);
      auVar6[2] = -(uStack_66 == uStack_46);
      auVar6[3] = -(uStack_65 == uStack_45);
      auVar6[4] = -(uStack_64 == uStack_44);
      auVar6[5] = -(uStack_63 == uStack_43);
      auVar6[6] = -(uStack_62 == uStack_42);
      auVar6[7] = -(uStack_61 == uStack_41);
      auVar6[8] = -(uStack_60 == uStack_40);
      auVar6[9] = -(uStack_5f == uStack_3f);
      auVar6[10] = -(uStack_5e == uStack_3e);
      auVar6[0xb] = -(uStack_5d == uStack_3d);
      auVar6[0xc] = -(uStack_5c == uStack_3c);
      auVar6[0xd] = -(uStack_5b == uStack_3b);
      auVar6[0xe] = -(uStack_5a == uStack_3a);
      auVar6[0xf] = -(uStack_59 == uStack_39);
      auVar5[0] = -((uchar)local_78._M_device == (uchar)local_58);
      auVar5[1] = -(local_78._M_device._1_1_ == local_58._1_1_);
      auVar5[2] = -(local_78._M_device._2_1_ == local_58._2_1_);
      auVar5[3] = -(local_78._M_device._3_1_ == local_58._3_1_);
      auVar5[4] = -(local_78._M_device._4_1_ == local_58._4_1_);
      auVar5[5] = -(local_78._M_device._5_1_ == local_58._5_1_);
      auVar5[6] = -(local_78._M_device._6_1_ == local_58._6_1_);
      auVar5[7] = -(local_78._M_device._7_1_ == local_58._7_1_);
      auVar5[8] = -(local_78._M_owns == (bool)uStack_50);
      auVar5[9] = -(local_78._9_1_ == uStack_4f);
      auVar5[10] = -(local_78._10_1_ == uStack_4e);
      auVar5[0xb] = -(local_78._11_1_ == uStack_4d);
      auVar5[0xc] = -(local_78._12_1_ == uStack_4c);
      auVar5[0xd] = -(local_78._13_1_ == uStack_4b);
      auVar5[0xe] = -(local_78._14_1_ == uStack_4a);
      auVar5[0xf] = -(local_78._15_1_ == uStack_49);
      auVar5 = auVar5 & auVar6;
      local_79 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
    }
    inline_check_non_fatal<bool>
              (&local_79,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x39f,"GetUTXOStats","!pindex || pindex->GetBlockHash() == view->GetBestBlock()");
    kernel::ComputeUTXOStats
              (__return_storage_ptr__,(kernel *)(ulong)hash_type,(CoinStatsHashType)view,
               (CCoinsView *)blockman,(BlockManager *)interruption_point,(function<void_()> *)pindex
              );
  }
  if (*(optional<kernel::CCoinsStats> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(optional<kernel::CCoinsStats> **)(in_FS_OFFSET + 0x28);
  }
LAB_009a08e9:
  __stack_chk_fail();
}

Assistant:

static std::optional<kernel::CCoinsStats> GetUTXOStats(CCoinsView* view, node::BlockManager& blockman,
                                                       kernel::CoinStatsHashType hash_type,
                                                       const std::function<void()>& interruption_point = {},
                                                       const CBlockIndex* pindex = nullptr,
                                                       bool index_requested = true)
{
    // Use CoinStatsIndex if it is requested and available and a hash_type of Muhash or None was requested
    if ((hash_type == kernel::CoinStatsHashType::MUHASH || hash_type == kernel::CoinStatsHashType::NONE) && g_coin_stats_index && index_requested) {
        if (pindex) {
            return g_coin_stats_index->LookUpStats(*pindex);
        } else {
            CBlockIndex& block_index = *CHECK_NONFATAL(WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock())));
            return g_coin_stats_index->LookUpStats(block_index);
        }
    }

    // If the coinstats index isn't requested or is otherwise not usable, the
    // pindex should either be null or equal to the view's best block. This is
    // because without the coinstats index we can only get coinstats about the
    // best block.
    CHECK_NONFATAL(!pindex || pindex->GetBlockHash() == view->GetBestBlock());

    return kernel::ComputeUTXOStats(hash_type, view, blockman, interruption_point);
}